

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfWav.cpp
# Opt level: O0

void Imf_2_5::anon_unknown_0::wenc14
               (unsigned_short a,unsigned_short b,unsigned_short *l,unsigned_short *h)

{
  short ds;
  short ms;
  short bs;
  short as;
  unsigned_short *h_local;
  unsigned_short *l_local;
  unsigned_short b_local;
  unsigned_short a_local;
  
  *l = (unsigned_short)((int)(short)a + (int)(short)b >> 1);
  *h = a - b;
  return;
}

Assistant:

inline void
wenc14 (unsigned short  a, unsigned short  b,
        unsigned short &l, unsigned short &h)
{
    short as = a;
    short bs = b;

    short ms = (as + bs) >> 1;
    short ds = as - bs;

    l = ms;
    h = ds;
}